

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<TPZGeoElSidePartition>::Resize(TPZVec<TPZGeoElSidePartition> *this,int64_t newsize)

{
  undefined8 *puVar1;
  TPZGeoElSidePartition *pTVar2;
  undefined1 auVar3 [16];
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  int64_t *piVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  
  if (newsize < 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::ostream::flush();
  }
  lVar9 = this->fNElements;
  if (lVar9 != newsize) {
    if (newsize == 0) {
      this->fNElements = 0;
      this->fNAlloc = 0;
      pTVar2 = this->fStore;
      if (pTVar2 != (TPZGeoElSidePartition *)0x0) {
        lVar9 = pTVar2[-1].fPartition.fNAlloc;
        if (lVar9 != 0) {
          lVar8 = lVar9 * 0x38;
          do {
            ~TPZVec((TPZVec<TPZGeoElSidePartition> *)((long)pTVar2 + lVar8 + -0x20));
            lVar8 = lVar8 + -0x38;
          } while (lVar8 != 0);
        }
        operator_delete__(&pTVar2[-1].fPartition.fNAlloc,lVar9 * 0x38 + 8);
      }
      this->fStore = (TPZGeoElSidePartition *)0x0;
    }
    else {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = newsize;
      uVar5 = SUB168(auVar3 * ZEXT816(0x38),0);
      uVar6 = uVar5 + 8;
      if (0xfffffffffffffff7 < uVar5) {
        uVar6 = 0xffffffffffffffff;
      }
      uVar5 = 0xffffffffffffffff;
      if (SUB168(auVar3 * ZEXT816(0x38),8) == 0) {
        uVar5 = uVar6;
      }
      piVar7 = (int64_t *)operator_new__(uVar5);
      *piVar7 = newsize;
      lVar8 = 0;
      do {
        *(undefined ***)((long)piVar7 + lVar8 + 8) = &PTR__TPZGeoElSide_0172da80;
        *(undefined8 *)((long)piVar7 + lVar8 + 0x10) = 0;
        *(undefined4 *)((long)piVar7 + lVar8 + 0x18) = 0xffffffff;
        *(undefined ***)((long)piVar7 + lVar8 + 0x20) = &PTR__TPZVec_0172e6d0;
        *(undefined8 *)((long)piVar7 + lVar8 + 0x38) = 0;
        puVar1 = (undefined8 *)((long)piVar7 + lVar8 + 0x28);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar8 = lVar8 + 0x38;
      } while (newsize * 0x38 - lVar8 != 0);
      if (newsize <= lVar9) {
        lVar9 = newsize;
      }
      lVar8 = 0;
      if (lVar9 < 1) {
        lVar9 = lVar8;
      }
      while( true ) {
        pTVar2 = this->fStore;
        bVar10 = lVar9 == 0;
        lVar9 = lVar9 + -1;
        if (bVar10) break;
        TPZGeoElSidePartition::operator=
                  ((TPZGeoElSidePartition *)
                   ((long)&(((TPZGeoElSidePartition *)(piVar7 + 1))->fCurrent).super_TPZSavable.
                           _vptr_TPZSavable + lVar8),
                   (TPZGeoElSidePartition *)
                   ((long)&(pTVar2->fCurrent).super_TPZSavable._vptr_TPZSavable + lVar8));
        lVar8 = lVar8 + 0x38;
      }
      if (pTVar2 != (TPZGeoElSidePartition *)0x0) {
        lVar9 = pTVar2[-1].fPartition.fNAlloc;
        if (lVar9 != 0) {
          lVar8 = lVar9 * 0x38;
          do {
            ~TPZVec((TPZVec<TPZGeoElSidePartition> *)((long)pTVar2 + lVar8 + -0x20));
            lVar8 = lVar8 + -0x38;
          } while (lVar8 != 0);
        }
        operator_delete__(&pTVar2[-1].fPartition.fNAlloc,lVar9 * 0x38 + 8);
      }
      this->fStore = (TPZGeoElSidePartition *)(piVar7 + 1);
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}